

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

string * re2c::output_get_state_abi_cxx11_(void)

{
  bool bVar1;
  opt_t *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  bVar1 = poVar2->state_get_naked;
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (bVar1 == true) {
    std::__cxx11::string::string((string *)in_RDI,(string *)&poVar2->state_get);
  }
  else {
    std::operator+(in_RDI,&poVar2->state_get,"()");
  }
  return in_RDI;
}

Assistant:

std::string output_get_state ()
{
	return opts->state_get_naked
		? opts->state_get
		: opts->state_get + "()";
}